

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.cc
# Opt level: O3

uchar * SHA256(uchar *d,size_t n,uchar *md)

{
  SHA256_CTX ctx;
  SHA256_CTX local_90;
  
  BCM_sha256_init(&local_90);
  BCM_sha256_update(&local_90,d,n);
  BCM_sha256_final(md,&local_90);
  OPENSSL_cleanse(&local_90,0x70);
  return md;
}

Assistant:

uint8_t *SHA256(const uint8_t *data, size_t len,
                uint8_t out[SHA256_DIGEST_LENGTH]) {
  SHA256_CTX ctx;
  BCM_sha256_init(&ctx);
  BCM_sha256_update(&ctx, data, len);
  BCM_sha256_final(out, &ctx);
  OPENSSL_cleanse(&ctx, sizeof(ctx));
  return out;
}